

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void temp_allocate_frame(TCGContext_conflict9 *s,TCGTemp *ts)

{
  ulong uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  
  uVar1 = s->current_frame_offset + 7U & 0xfffffffffffffff8;
  s->current_frame_offset = uVar1;
  if ((long)(uVar1 + 8) <= s->frame_end) {
    ts->mem_offset = uVar1;
    ts->mem_base = s->frame_temp;
    ts->field_0x4 = ts->field_0x4 | 0x10;
    s->current_frame_offset = s->current_frame_offset + 8;
    return;
  }
  fprintf(_stderr,"%s:%d: tcg fatal error\n",
          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
          ,0xb4b,in_R8,in_R9,uVar1);
  abort();
}

Assistant:

static void temp_allocate_frame(TCGContext *s, TCGTemp *ts)
{
#if !(defined(__sparc__) && TCG_TARGET_REG_BITS == 64)
    /* Sparc64 stack is accessed with offset of 2047 */
    s->current_frame_offset = (s->current_frame_offset +
                               (tcg_target_long)sizeof(tcg_target_long) - 1) &
        ~(sizeof(tcg_target_long) - 1);
#endif
    if (s->current_frame_offset + (tcg_target_long)sizeof(tcg_target_long) >
        s->frame_end) {
        tcg_abort();
    }
    ts->mem_offset = s->current_frame_offset;
    ts->mem_base = s->frame_temp;
    ts->mem_allocated = 1;
    s->current_frame_offset += sizeof(tcg_target_long);
}